

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Mf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  int c;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  char Buffer [200];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Mf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002b31b7:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDWaekmcgvwh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Empty GIA network.\n");
      return 1;
    }
    pNew_00 = Mf_ManPerformMapping(pAbc->pGia,(Jf_Par_t *)&pPars);
    if (pNew_00 == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n");
      return 1;
    }
    if (Pars.fCutMin != 0) {
      Cnf_DataFree((Cnf_Dat_t *)pAbc->pGia->pData);
      pAbc->pGia->pData = (void *)0x0;
    }
    Abc_FrameUpdateGia(pAbc,pNew_00);
    return 0;
  }
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by a positive integer.\n");
      goto LAB_002b3822;
    }
    Pars.nProcNum = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nProcNum;
    break;
  default:
    goto switchD_002b3209_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
      goto LAB_002b3822;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (((int)pPars._4_4_ < 1) || (Pars.fVeryVerbose < (int)pPars._4_4_)) {
      Abc_Print(-1,"This number of cuts (%d) is not supported.\n",(ulong)pPars._4_4_);
      goto LAB_002b3822;
    }
    goto LAB_002b31b7;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by a floating point number.\n");
      goto LAB_002b3822;
    }
    Pars.nDelayLut2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((double)Pars.nDelayLut2 <= 0.0) goto LAB_002b3822;
    goto LAB_002b31b7;
  case 0x45:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-E\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRelaxRatio = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRelaxRatio;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by a positive integer.\n");
      goto LAB_002b3822;
    }
    Pars.nCutNum = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nCutNum;
    break;
  case 0x4b:
    if (globalUtilOptind < argc) goto LAB_002b3231;
    Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
    goto LAB_002b3822;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRoundsEla = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRoundsEla;
    break;
  case 0x52:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRounds = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRounds;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by a positive integer.\n");
      goto LAB_002b3822;
    }
    Pars.nAreaTuner = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nAreaTuner;
    break;
  case 0x61:
    Pars.nFastEdges = Pars.nFastEdges ^ 1;
    goto LAB_002b31b7;
  case 99:
    Pars.fCutMin = Pars.fCutMin ^ 1;
    goto LAB_002b31b7;
  case 0x65:
    Pars.fPinQuick = Pars.fPinQuick ^ 1;
    goto LAB_002b31b7;
  case 0x67:
    Pars.fAddOrCla = Pars.fAddOrCla ^ 1;
    goto LAB_002b31b7;
  case 0x68:
switchD_002b3209_caseD_42:
    goto LAB_002b3822;
  case 0x6b:
    Pars.fUseMux7 = Pars.fUseMux7 ^ 1;
    goto LAB_002b31b7;
  case 0x6d:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_002b31b7;
  case 0x76:
    Pars.fCutSimple = Pars.fCutSimple ^ 1;
    goto LAB_002b31b7;
  case 0x77:
    Pars.fCutGroup = Pars.fCutGroup ^ 1;
    goto LAB_002b31b7;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar1 < 0) goto LAB_002b3822;
  goto LAB_002b31b7;
LAB_002b3231:
  pPars._0_4_ = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (((int)(uint)pPars < 2) || (Pars.fVerbose < (int)(uint)pPars)) {
    Abc_Print(-1,"LUT size %d is not supported.\n",(ulong)(uint)pPars);
LAB_002b3822:
    if (Pars.nDelayLut2 == -1) {
      sprintf((char *)&Pars.pTimesReq,"best possible");
    }
    else {
      sprintf((char *)&Pars.pTimesReq,"%d",(ulong)(uint)Pars.nDelayLut2);
    }
    Abc_Print(-2,"usage: &mf [-KCFARLED num] [-akmcgvwh]\n");
    Abc_Print(-2,"\t           performs technology mapping of the network\n");
    Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
              (ulong)(uint)Pars.fVerbose,(ulong)(uint)pPars);
    Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
              (ulong)(uint)Pars.fVeryVerbose,(ulong)pPars._4_4_);
    Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
              (ulong)(uint)Pars.nCutNum);
    Abc_Print(-2,"\t-A num   : the number of exact area rounds [default = %d]\n",
              (ulong)(uint)Pars.nProcNum);
    Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
              (ulong)(uint)Pars.nRounds);
    Abc_Print(-2,"\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
              (ulong)(uint)Pars.nRoundsEla);
    Abc_Print(-2,"\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
              (ulong)(uint)Pars.nRelaxRatio);
    Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
              &Pars.pTimesReq);
    pcVar2 = "no";
    if (Pars.nFastEdges != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fPinQuick != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fUseMux7 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fPower != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCutMin != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-c       : toggles mapping for CNF generation [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fAddOrCla != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCutSimple != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCutGroup != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h       : prints the command usage\n");
    return 1;
  }
  goto LAB_002b31b7;
}

Assistant:

int Abc_CommandAbc9Mf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Mf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDWaekmcgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'c':
            pPars->fGenCnf ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }

    pNew = Mf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    if ( pPars->fGenCnf )
        Cnf_DataFree( (Cnf_Dat_t*)pAbc->pGia->pData ), pAbc->pGia->pData = NULL;
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &mf [-KCFARLED num] [-akmcgvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds [default = %d]\n", pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n", pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n", pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles mapping for CNF generation [default = %s]\n", pPars->fGenCnf? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}